

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

int __thiscall GameLoop::loop(GameLoop *this,int maxTurn)

{
  Player *this_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference ppPVar4;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this_01;
  ostream *poVar5;
  int local_38;
  int iStack_34;
  bool limitTurns;
  int turnsLeft;
  int turnCounter;
  Player *currentPlayer;
  int currentPlayerPosition;
  bool gameNotDone;
  int maxTurn_local;
  GameLoop *this_local;
  
  currentPlayer._4_4_ = 0;
  iStack_34 = 1;
  local_38 = -1;
  if (maxTurn != -1) {
    sVar3 = std::vector<Player_*,_std::allocator<Player_*>_>::size(this->allPlayers);
    local_38 = maxTurn * (int)sVar3;
  }
  do {
    ppPVar4 = std::vector<Player_*,_std::allocator<Player_*>_>::at
                        (this->allPlayers,(long)currentPlayer._4_4_);
    this_00 = *ppPVar4;
    this_01 = Player::getOwnedCountries(this_00);
    bVar1 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::empty(this_01);
    if (bVar1) {
      currentPlayer._4_4_ = currentPlayer._4_4_ + 1;
      bVar1 = isRoundFinished(this,(long)currentPlayer._4_4_);
      if (bVar1) {
        currentPlayer._4_4_ = 0;
      }
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "\x1b[0m\n--------------------------------------------------------\n----------------------TURN "
                              );
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iStack_34);
      poVar5 = std::operator<<(poVar5,"----------------------------\n");
      poVar5 = std::operator<<(poVar5,"--------------------------------------------------------");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      local_38 = local_38 + -1;
      std::operator<<((ostream *)&std::cout,"\x1b[35m");
      Player::reinforce(this_00);
      std::operator<<((ostream *)&std::cout,"\x1b[33m");
      Player::attack(this_00);
      bVar1 = isGameDone(this_00,this->gameMap);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        Player::notifyAll(this_00);
        std::ostream::flush();
        iVar2 = Player::getPlayerId(this_00);
        return iVar2;
      }
      currentPlayer._4_4_ = currentPlayer._4_4_ + 1;
      bVar1 = isRoundFinished(this,(long)currentPlayer._4_4_);
      if (bVar1) {
        currentPlayer._4_4_ = 0;
      }
      std::operator<<((ostream *)&std::cout,"\x1b[34m");
      Player::fortify(this_00);
      iStack_34 = iStack_34 + 1;
    }
  } while ((maxTurn == -1) || (0 < local_38));
  std::operator<<((ostream *)&std::cout,"\x1b[1m\x1b[33m");
  poVar5 = std::operator<<((ostream *)&std::cout,"There are no more turns left. It is a draw!!");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  return -1;
}

Assistant:

int GameLoop::loop(int maxTurn) {
    bool gameNotDone;
    int currentPlayerPosition = 0;
    Player* currentPlayer = nullptr;
    int turnCounter = 1;

    //limit or not number of turns
    int turnsLeft = -1;
    bool limitTurns = false;
    if (maxTurn != -1) {
        turnsLeft = maxTurn * int(allPlayers->size());
        limitTurns = true;
    }

    do {
        currentPlayer = allPlayers->at(currentPlayerPosition);
        if (!currentPlayer->getOwnedCountries()->empty()) {
            std::cout << "\u001b[0m\n--------------------------------------------------------\n"
                         "----------------------TURN " << turnCounter << "----------------------------\n"
                      << "--------------------------------------------------------" << std::endl;
            turnsLeft--;

            cout << "\u001b[35m";
            currentPlayer->reinforce();

            cout << "\u001b[33m";
            currentPlayer->attack();

            gameNotDone = !isGameDone(currentPlayer, gameMap);

            if (gameNotDone) {
                currentPlayerPosition++;
                if (isRoundFinished(currentPlayerPosition)) {
                    currentPlayerPosition = 0;
                }
            } else {
                currentPlayer->notifyAll();
                cout.flush();
                return currentPlayer->getPlayerId();
            }

            cout << "\u001b[34m";
            currentPlayer->fortify();

            turnCounter++;
        } else {
            currentPlayerPosition++;
            if (isRoundFinished(currentPlayerPosition)) {
                currentPlayerPosition = 0;
            }
        }

        if (limitTurns && turnsLeft <= 0) {
            std::cout << "\033[1m\033[33m";
            std::cout << "There are no more turns left. It is a draw!!" << std::endl;
            return -1;
        }
    } while (true);
}